

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_column.h
# Opt level: O1

bool Gudhi::persistence_matrix::operator<
               (Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
                *c1,Set_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)1,_true,_true,_true>_>_>
                    *c2)

{
  uint uVar1;
  uint uVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  _Rb_tree_header *p_Var6;
  
  if (c1 == c2) {
    return false;
  }
  p_Var3 = (c1->column_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var4 = (c2->column_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var6 = &(c1->column_)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = &(c2->column_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var5 && (_Rb_tree_header *)p_Var3 != p_Var6) {
    do {
      uVar1 = *(uint *)(*(long *)(p_Var4 + 1) + 0x18);
      uVar2 = *(uint *)(*(long *)(p_Var3 + 1) + 0x18);
      if (uVar2 != uVar1) {
        return uVar2 < uVar1;
      }
      uVar1 = *(uint *)(*(long *)(p_Var4 + 1) + 4);
      uVar2 = *(uint *)(*(long *)(p_Var3 + 1) + 4);
      if (uVar2 != uVar1) {
        return uVar2 < uVar1;
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while (((_Rb_tree_header *)p_Var3 != p_Var6) && ((_Rb_tree_header *)p_Var4 != p_Var5));
  }
  return (_Rb_tree_header *)p_Var4 != p_Var5;
}

Assistant:

bool operator<(const Set_column& c1, const Set_column& c2) {
    if (&c1 == &c2) return false;

    auto it1 = c1.column_.begin();
    auto it2 = c2.column_.begin();
    while (it1 != c1.column_.end() && it2 != c2.column_.end()) {
      if ((*it1)->get_row_index() != (*it2)->get_row_index()) return (*it1)->get_row_index() < (*it2)->get_row_index();
      if constexpr (!Master_matrix::Option_list::is_z2) {
        if ((*it1)->get_element() != (*it2)->get_element()) return (*it1)->get_element() < (*it2)->get_element();
      }
      ++it1;
      ++it2;
    }
    return it2 != c2.column_.end();
  }